

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::AssertionExpr_const*>::
emplace_back<slang::ast::AssertionExpr_const*>
          (SmallVectorBase<slang::ast::AssertionExpr_const*> *this,AssertionExpr **args)

{
  iterator ppAVar1;
  AssertionExpr **args_local;
  SmallVectorBase<const_slang::ast::AssertionExpr_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppAVar1 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::end
                        ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
    this_local = (SmallVectorBase<const_slang::ast::AssertionExpr_*> *)
                 emplaceRealloc<slang::ast::AssertionExpr_const*>(this,ppAVar1,args);
  }
  else {
    ppAVar1 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::end
                        ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
    *ppAVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<const_slang::ast::AssertionExpr_*> *)
                 SmallVectorBase<const_slang::ast::AssertionExpr_*>::back
                           ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }